

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

ImFontGlyph * __thiscall ImFont::FindGlyphNoFallback(ImFont *this,ImWchar c)

{
  value_type_conflict4 *pvVar1;
  ImFontGlyph *pIVar2;
  undefined2 in_register_00000032;
  
  if (CONCAT22(in_register_00000032,c) < (this->IndexLookup).Size) {
    pvVar1 = ImVector<unsigned_short>::operator[]
                       (&this->IndexLookup,CONCAT22(in_register_00000032,c));
    pIVar2 = (ImFontGlyph *)0x0;
    if ((ulong)*pvVar1 != 0xffff) {
      pIVar2 = (this->Glyphs).Data + *pvVar1;
    }
    return pIVar2;
  }
  return (ImFontGlyph *)0x0;
}

Assistant:

const ImFontGlyph* ImFont::FindGlyphNoFallback(ImWchar c) const
{
    if (c >= IndexLookup.Size)
        return NULL;
    const unsigned short i = IndexLookup[c];
    if (i == (unsigned short)-1)
        return NULL;
    return &Glyphs.Data[i];
}